

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::SetScissorRects
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,Uint32 NumRects,Rect *pRects,
          Uint32 *RTWidth,Uint32 *RTHeight)

{
  Uint32 *pUVar1;
  Int32 IVar2;
  Int32 IVar3;
  Int32 IVar4;
  COMMAND_QUEUE_TYPE CVar5;
  ulong uVar6;
  Rect *extraout_RDX;
  Rect *pRVar7;
  Uint32 sr;
  ulong uVar8;
  char (*in_R9) [8];
  char (*in_stack_ffffffffffffff78) [2];
  Uint32 NumRects_local;
  string msg;
  String local_50;
  
  CVar5 = (this->m_Desc).QueueType;
  pRVar7 = pRects;
  NumRects_local = NumRects;
  if (CVar5 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&msg,(char (*) [79])
                      "Queue type may never be unknown for immediate contexts. This looks like a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3c5);
      std::__cxx11::string::~string((string *)&msg);
    }
    FormatString<char[97]>
              (&msg,(char (*) [97])
                    "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3c5);
    std::__cxx11::string::~string((string *)&msg);
    CVar5 = (this->m_Desc).QueueType;
    pRVar7 = extraout_RDX;
  }
  if ((~CVar5 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_
              (&local_50,(Diligent *)(ulong)CVar5,(COMMAND_QUEUE_TYPE)pRVar7);
    FormatString<char[16],char[22],std::__cxx11::string,char[8]>
              (&msg,(Diligent *)"SetScissorRects",(char (*) [16])0x2e3525,(char (*) [22])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&local_50);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3c5);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((1 < NumRects) &&
     ((((this->m_pDevice).m_pObject)->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
      m_DeviceInfo.Features.MultiViewport == DEVICE_FEATURE_STATE_DISABLED)) {
    FormatString<char[80]>
              (&msg,(char (*) [80])
                    "IDeviceContext::SetScissorRects: multi viewport is not supported by this device"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3ca);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((*RTWidth == 0) || (*RTHeight == 0)) {
    *RTWidth = this->m_FramebufferWidth;
    *RTHeight = this->m_FramebufferHeight;
  }
  if (0xf < NumRects) {
    FormatString<char[26],unsigned_int,char[22],unsigned_int,char[2]>
              (&msg,(Diligent *)"Number of scissor rects (",(char (*) [26])&NumRects_local,
               (uint *)") exceeds the limit (",(char (*) [22])&MAX_VIEWPORTS,(uint *)0x2caa26,
               in_stack_ffffffffffffff78);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3d2);
    std::__cxx11::string::~string((string *)&msg);
    NumRects = NumRects_local;
  }
  uVar6 = 0x10;
  if (NumRects < 0x10) {
    uVar6 = (ulong)NumRects;
  }
  this->m_NumScissorRects = (Uint32)uVar6;
  pRVar7 = this->m_ScissorRects;
  for (uVar8 = 0; uVar8 < uVar6; uVar8 = uVar8 + 1) {
    IVar2 = pRects->top;
    IVar3 = pRects->right;
    IVar4 = pRects->bottom;
    pRVar7->left = pRects->left;
    pRVar7->top = IVar2;
    pRVar7->right = IVar3;
    pRVar7->bottom = IVar4;
    if (pRVar7->right < pRVar7->left) {
      FormatString<char[49],int,char[3],int,char[2]>
                (&msg,(Diligent *)"Incorrect horizontal bounds for a scissor rect [",
                 (char (*) [49])pRVar7,(int *)0x2ed5a5,(char (*) [3])&pRVar7->right,(int *)0x2caa26,
                 in_stack_ffffffffffffff78);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3d8);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (pRVar7->bottom < pRVar7->top) {
      FormatString<char[47],int,char[3],int,char[2]>
                (&msg,(Diligent *)"Incorrect vertical bounds for a scissor rect [",
                 (char (*) [47])&pRVar7->top,(int *)0x2ed5a5,(char (*) [3])&pRVar7->bottom,
                 (int *)0x2caa26,in_stack_ffffffffffffff78);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3d9);
      std::__cxx11::string::~string((string *)&msg);
    }
    uVar6 = (ulong)this->m_NumScissorRects;
    pRects = pRects + 1;
    pRVar7 = pRVar7 + 1;
  }
  pUVar1 = &(this->m_Stats).CommandCounters.SetScissorRects;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetScissorRects(
    Uint32      NumRects,
    const Rect* pRects,
    Uint32&     RTWidth,
    Uint32&     RTHeight)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetScissorRects");

    if (NumRects > 1)
    {
        DEV_CHECK_ERR(m_pDevice->GetFeatures().MultiViewport,
                      "IDeviceContext::SetScissorRects: multi viewport is not supported by this device");
    }
    if (RTWidth == 0 || RTHeight == 0)
    {
        RTWidth  = m_FramebufferWidth;
        RTHeight = m_FramebufferHeight;
    }

    DEV_CHECK_ERR(NumRects < MAX_VIEWPORTS, "Number of scissor rects (", NumRects, ") exceeds the limit (", MAX_VIEWPORTS, ")");
    m_NumScissorRects = (std::min)(MAX_VIEWPORTS, NumRects);

    for (Uint32 sr = 0; sr < m_NumScissorRects; ++sr)
    {
        m_ScissorRects[sr] = pRects[sr];
        DEV_CHECK_ERR(m_ScissorRects[sr].left <= m_ScissorRects[sr].right, "Incorrect horizontal bounds for a scissor rect [", m_ScissorRects[sr].left, ", ", m_ScissorRects[sr].right, ")");
        DEV_CHECK_ERR(m_ScissorRects[sr].top <= m_ScissorRects[sr].bottom, "Incorrect vertical bounds for a scissor rect [", m_ScissorRects[sr].top, ", ", m_ScissorRects[sr].bottom, ")");
    }

    ++m_Stats.CommandCounters.SetScissorRects;
}